

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestTailCallerImpl::foo(TestTailCallerImpl *this,FooContext context)

{
  CapTableReader *pCVar1;
  RequestHook *pRVar2;
  uint uVar3;
  long *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Promise<void> PVar10;
  Reader value;
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  tailRequest;
  Reader params;
  undefined1 local_f0 [16];
  CapTableReader *pCStack_e0;
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_d8;
  PointerBuilder local_98;
  int iStack_80;
  undefined4 uStack_7c;
  StructReader local_78;
  undefined1 local_48 [16];
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_98);
  local_d8.super_Builder._builder.pointers = (WirePointer *)CONCAT44(uStack_7c,iStack_80);
  local_d8.super_Builder._builder.data = local_98.pointer;
  local_d8.super_Builder._builder.segment = local_98.segment;
  local_d8.super_Builder._builder.capTable = local_98.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_d8,(word *)0x0);
  bVar5 = local_78.pointerCount != 0;
  local_98.pointer = (WirePointer *)0x0;
  if (bVar5) {
    local_98.pointer = local_78.pointers;
  }
  iStack_80 = 0x7fffffff;
  if (bVar5) {
    iStack_80 = local_78.nestingLimit;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (bVar5) {
    uVar6 = local_78.segment._0_4_;
    uVar7 = local_78.segment._4_4_;
    uVar8 = local_78.capTable._0_4_;
    uVar9 = local_78.capTable._4_4_;
  }
  local_98.segment = (SegmentBuilder *)CONCAT44(uVar7,uVar6);
  local_98.capTable = (CapTableBuilder *)CONCAT44(uVar9,uVar8);
  PointerReader::getCapability((PointerReader *)local_48);
  local_f0._8_8_ = local_48._0_8_;
  pCStack_e0 = (CapTableReader *)local_48._8_8_;
  local_f0._0_8_ = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCallee::Client::fooRequest
            (&local_d8,(Client *)local_f0,&local_38);
  pCVar1 = pCStack_e0;
  if (pCStack_e0 != (CapTableReader *)0x0) {
    pCStack_e0 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_f0._8_8_)->_vptr_Arena)
              (local_f0._8_8_,pCVar1->_vptr_CapTableReader[-2] + (long)&pCVar1->_vptr_CapTableReader
              );
  }
  uVar3 = 0;
  if (0x1f < local_78.dataSize) {
    uVar3 = *local_78.data;
  }
  ((WireValue<uint32_t>_conflict *)local_d8.super_Builder._builder.data)->value = uVar3;
  local_98.segment = local_d8.super_Builder._builder.segment;
  local_98.capTable = local_d8.super_Builder._builder.capTable;
  local_98.pointer = local_d8.super_Builder._builder.pointers;
  value.super_StringPtr.content.size_ = 0x14;
  value.super_StringPtr.content.ptr = "from TestTailCaller";
  PointerBuilder::setBlob<capnp::Text>(&local_98,value);
  (**(code **)(*in_RDX + 0x18))(this);
  pRVar2 = local_d8.hook.ptr;
  pPVar4 = extraout_RDX;
  if (local_d8.hook.ptr != (RequestHook *)0x0) {
    local_d8.hook.ptr = (RequestHook *)0x0;
    (**(local_d8.hook.disposer)->_vptr_Disposer)
              (local_d8.hook.disposer,
               pRVar2->_vptr_RequestHook[-2] + (long)&pRVar2->_vptr_RequestHook);
    pPVar4 = extraout_RDX_00;
  }
  PVar10.super_PromiseBase.node.ptr = pPVar4;
  PVar10.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar10.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestTailCallerImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto tailRequest = params.getCallee().fooRequest();
  tailRequest.setI(params.getI());
  tailRequest.setT("from TestTailCaller");
  return context.tailCall(kj::mv(tailRequest));
}